

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O2

void com_deblock_set_edge(com_core_t *core)

{
  com_map_t *map;
  com_ref_pic_t (*refp) [2];
  s8 asVar1 [2];
  s8 asVar2 [2];
  uint uVar3;
  uint uVar4;
  com_seqh_t *pcVar5;
  s8 *psVar6;
  u8 *puVar7;
  s8 (*pasVar8) [2];
  s16 (*paasVar9) [2] [2];
  int iVar10;
  int scu_y;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  com_pic_t *pcVar18;
  int cuh;
  int cuw;
  byte bVar19;
  ushort uVar20;
  int iVar21;
  long lVar22;
  com_pic_t *pcVar23;
  byte *pbVar24;
  com_pic_t *pcVar25;
  com_pic_t *pcVar26;
  long lVar27;
  bool bVar28;
  com_pic_t *local_60;
  com_pic_t *local_58;
  
  pcVar5 = core->seqhdr;
  psVar6 = (core->map).map_patch;
  lVar22 = (long)core->cu_scup;
  lVar16 = (long)core->lcu_x + (long)pcVar5->pic_width_in_lcu * (long)core->lcu_y;
  cuw = core->cu_width >> 2;
  cuh = core->cu_height >> 2;
  uVar3 = core->cu_pix_x;
  iVar10 = (int)uVar3 >> 2;
  uVar4 = core->cu_pix_y;
  scu_y = (int)uVar4 >> 2;
  iVar12 = pcVar5->i_scu;
  lVar27 = (long)iVar12;
  if (((byte)(core->map).map_scu[lVar22] & 0x12) != 0) {
    puVar7 = (core->map).map_edge;
    iVar14 = core->tb_part;
    if (iVar14 == 5) {
      uVar11 = cuh / 2 + scu_y;
      if ((uVar11 & 1) == 0) {
        for (lVar17 = 0; cuw != (int)lVar17; lVar17 = lVar17 + 1) {
          puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] =
               puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] | 4;
        }
      }
      uVar11 = iVar10 + cuw / 2;
      if ((uVar11 & 1) == 0) {
        pbVar24 = puVar7 + (int)(scu_y * iVar12 + uVar11);
        iVar12 = cuh;
        while (bVar28 = iVar12 != 0, iVar12 = iVar12 + -1, bVar28) {
          *pbVar24 = *pbVar24 | 1;
          pbVar24 = pbVar24 + lVar27;
        }
      }
    }
    else if (iVar14 == 7) {
      uVar11 = iVar10 + cuw / 4;
      if ((uVar11 & 1) == 0) {
        pbVar24 = puVar7 + (int)(scu_y * iVar12 + uVar11);
        iVar14 = cuh;
        while (bVar28 = iVar14 != 0, iVar14 = iVar14 + -1, bVar28) {
          *pbVar24 = *pbVar24 | 1;
          pbVar24 = pbVar24 + lVar27;
        }
      }
      uVar11 = cuw / 2 + iVar10;
      if ((uVar11 & 1) == 0) {
        pbVar24 = puVar7 + (int)(scu_y * iVar12 + uVar11);
        iVar14 = cuh;
        while (bVar28 = iVar14 != 0, iVar14 = iVar14 + -1, bVar28) {
          *pbVar24 = *pbVar24 | 1;
          pbVar24 = pbVar24 + lVar27;
        }
      }
      uVar11 = iVar10 + (cuw / 4) * 3;
      if ((uVar11 & 1) == 0) {
        pbVar24 = puVar7 + (int)(scu_y * iVar12 + uVar11);
        iVar12 = cuh;
        while (bVar28 = iVar12 != 0, iVar12 = iVar12 + -1, bVar28) {
          *pbVar24 = *pbVar24 | 1;
          pbVar24 = pbVar24 + lVar27;
        }
      }
    }
    else if (iVar14 == 6) {
      uVar11 = scu_y + cuh / 4;
      if ((uVar11 & 1) == 0) {
        for (lVar17 = 0; cuw != (int)lVar17; lVar17 = lVar17 + 1) {
          puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] =
               puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] | 4;
        }
      }
      uVar11 = cuh / 2 + scu_y;
      if ((uVar11 & 1) == 0) {
        for (lVar17 = 0; cuw != (int)lVar17; lVar17 = lVar17 + 1) {
          puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] =
               puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] | 4;
        }
      }
      uVar11 = scu_y + (cuh / 4) * 3;
      if ((uVar11 & 1) == 0) {
        for (lVar17 = 0; cuw != (int)lVar17; lVar17 = lVar17 + 1) {
          puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] =
               puVar7[lVar17 + (int)(uVar11 * iVar12 + iVar10)] | 4;
        }
      }
    }
    if (((char)((uVar4 & 4) >> 2) == '\0' && 3 < uVar4) &&
       (((core->cu_pix_y != core->lcu_pix_y || (pcVar5->cross_patch_loop_filter != '\0')) ||
        (psVar6[lVar16] == psVar6[(long)(int)lVar16 - (long)pcVar5->pic_width_in_lcu])))) {
      for (lVar17 = 0; cuw != (int)lVar17; lVar17 = lVar17 + 1) {
        puVar7[lVar17 + lVar22] = puVar7[lVar17 + lVar22] | 0xc;
      }
    }
    if ((char)((uVar3 & 4) >> 2) != '\0' || uVar3 < 4) {
      return;
    }
    if (((core->cu_pix_x == core->lcu_pix_x) && (pcVar5->cross_patch_loop_filter == '\0')) &&
       (psVar6[lVar16] != psVar6[lVar16 + -1])) {
      return;
    }
    pbVar24 = puVar7 + lVar22;
    while (bVar28 = cuh != 0, cuh = cuh + -1, bVar28) {
      *pbVar24 = *pbVar24 | 3;
      pbVar24 = pbVar24 + lVar27;
    }
    return;
  }
  map = &core->map;
  refp = core->refp;
  iVar14 = core->tb_part;
  if (iVar14 == 5) {
    uVar11 = cuh / 2 + scu_y;
    if ((uVar11 & 1) == 0) {
      com_df_set_edge_hor(map,iVar12,refp,iVar10,uVar11,cuw,iVar10);
    }
    uVar11 = cuw / 2 + iVar10;
  }
  else {
    if (iVar14 != 7) {
      if (iVar14 == 6) {
        uVar11 = scu_y + cuh / 4;
        if ((uVar11 & 1) == 0) {
          com_df_set_edge_hor(map,iVar12,refp,iVar10,uVar11,cuw,iVar10);
        }
        uVar11 = cuh / 2 + scu_y;
        if ((uVar11 & 1) == 0) {
          com_df_set_edge_hor(map,iVar12,refp,iVar10,uVar11,cuw,iVar10);
        }
        uVar11 = (cuh / 4) * 3 + scu_y;
        if ((uVar11 & 1) == 0) {
          com_df_set_edge_hor(map,iVar12,refp,iVar10,uVar11,cuw,iVar10);
        }
      }
      goto LAB_001120aa;
    }
    uVar11 = cuw / 4 + iVar10;
    if ((uVar11 & 1) == 0) {
      com_df_set_edge_ver(map,iVar12,refp,uVar11,scu_y,cuh,iVar10);
    }
    uVar11 = cuw / 2 + iVar10;
    if ((uVar11 & 1) == 0) {
      com_df_set_edge_ver(map,iVar12,refp,uVar11,scu_y,cuh,iVar10);
    }
    uVar11 = (cuw / 4) * 3 + iVar10;
  }
  if ((uVar11 & 1) == 0) {
    com_df_set_edge_ver(map,iVar12,refp,uVar11,scu_y,cuh,iVar10);
  }
LAB_001120aa:
  if (((char)((uVar4 & 4) >> 2) == '\0' && 3 < uVar4) &&
     (((core->cu_pix_y != core->lcu_pix_y || (pcVar5->cross_patch_loop_filter != '\0')) ||
      (psVar6[lVar16] == psVar6[(long)(int)lVar16 - (long)pcVar5->pic_width_in_lcu])))) {
    pasVar8 = (core->map).map_refi;
    lVar22 = (long)(scu_y * iVar12 + iVar10);
    if ((long)pasVar8[lVar22][0] < 0) {
      local_60 = (com_pic_t *)0x0;
    }
    else {
      local_60 = refp[pasVar8[lVar22][0]][0].pic;
    }
    if ((long)pasVar8[lVar22][1] < 0) {
      local_58 = (com_pic_t *)0x0;
    }
    else {
      local_58 = core->refp[pasVar8[lVar22][1]][1].pic;
    }
    puVar7 = (core->map).map_edge;
    iVar14 = (scu_y + -1) * iVar12 + iVar10;
    lVar17 = lVar22;
    while (bVar28 = cuw != 0, cuw = cuw + -1, bVar28) {
      if (((byte)(core->map).map_scu[iVar14] & 0x12) == 0) {
        asVar1 = pasVar8[lVar22];
        asVar2 = (core->map).map_refi[iVar14];
        if (asVar1 != asVar2) {
          if (asVar2[0] < '\0') {
            pcVar18 = (com_pic_t *)0x0;
          }
          else {
            pcVar18 = *(com_pic_t **)((long)&(*refp)[0].pic + (ulong)(((ushort)asVar2 & 0x7f) << 6))
            ;
          }
          if ((short)asVar2 < 0) {
            pcVar23 = (com_pic_t *)0x0;
          }
          else {
            pcVar23 = core->refp[(ushort)asVar2 >> 8][1].pic;
          }
          if ((pcVar23 == local_60) && (pcVar18 == local_58)) {
            paasVar9 = (core->map).map_mv;
            if (asVar1[0] < '\0') {
LAB_001122f1:
              if (-1 < (short)asVar1) {
                iVar21 = (int)paasVar9[lVar17][1][0] - (int)paasVar9[iVar14][0][0];
                uVar20 = (ushort)iVar21;
                uVar13 = -uVar20;
                if (0 < iVar21) {
                  uVar13 = uVar20;
                }
                if (3 < uVar13) goto LAB_001121a3;
                iVar15 = (int)paasVar9[lVar17][1][1] - (int)paasVar9[iVar14][0][1];
                iVar21 = -iVar15;
                if (0 < iVar15) {
                  iVar21 = iVar15;
                }
                uVar20 = (ushort)iVar21;
                goto joined_r0x0011232e;
              }
              goto LAB_00112334;
            }
            iVar21 = (int)paasVar9[lVar17][0][0] - (int)paasVar9[iVar14][1][0];
            uVar20 = (ushort)iVar21;
            uVar13 = -uVar20;
            if (0 < iVar21) {
              uVar13 = uVar20;
            }
            if (uVar13 < 4) {
              iVar15 = (int)paasVar9[lVar17][0][1] - (int)paasVar9[iVar14][1][1];
              iVar21 = -iVar15;
              if (0 < iVar15) {
                iVar21 = iVar15;
              }
              if ((ushort)iVar21 < 4) goto LAB_001122f1;
            }
          }
          goto LAB_001121a3;
        }
        paasVar9 = (core->map).map_mv;
        if (-1 < asVar1[0]) {
          iVar21 = (int)paasVar9[lVar17][0][0] - (int)paasVar9[iVar14][0][0];
          uVar20 = (ushort)iVar21;
          uVar13 = -uVar20;
          if (0 < iVar21) {
            uVar13 = uVar20;
          }
          if (uVar13 < 4) {
            iVar15 = (int)paasVar9[lVar17][0][1] - (int)paasVar9[iVar14][0][1];
            iVar21 = -iVar15;
            if (0 < iVar15) {
              iVar21 = iVar15;
            }
            if ((ushort)iVar21 < 4) goto LAB_0011220d;
          }
          goto LAB_001121a3;
        }
LAB_0011220d:
        if (-1 < (short)asVar1) {
          iVar21 = (int)paasVar9[lVar17][1][0] - (int)paasVar9[iVar14][1][0];
          uVar20 = (ushort)iVar21;
          uVar13 = -uVar20;
          if (0 < iVar21) {
            uVar13 = uVar20;
          }
          if (uVar13 < 4) {
            iVar15 = (int)paasVar9[lVar17][1][1] - (int)paasVar9[iVar14][1][1];
            iVar21 = -iVar15;
            if (0 < iVar15) {
              iVar21 = iVar15;
            }
            uVar20 = (ushort)iVar21;
joined_r0x0011232e:
            if (uVar20 < 4) goto LAB_00112334;
          }
          goto LAB_001121a3;
        }
LAB_00112334:
        bVar19 = 0;
      }
      else {
LAB_001121a3:
        bVar19 = 0xc;
      }
      pbVar24 = puVar7 + lVar17;
      *pbVar24 = *pbVar24 | bVar19;
      iVar14 = iVar14 + 1;
      lVar17 = lVar17 + 1;
    }
  }
  if (((char)((uVar3 & 4) >> 2) == '\0' && 3 < uVar3) &&
     (((core->cu_pix_x != core->lcu_pix_x || (pcVar5->cross_patch_loop_filter != '\0')) ||
      (psVar6[lVar16] == psVar6[lVar16 + -1])))) {
    pasVar8 = (core->map).map_refi;
    lVar16 = (long)(scu_y * iVar12 + iVar10);
    if ((long)pasVar8[lVar16][0] < 0) {
      pcVar18 = (com_pic_t *)0x0;
    }
    else {
      pcVar18 = refp[pasVar8[lVar16][0]][0].pic;
    }
    if ((long)pasVar8[lVar16][1] < 0) {
      pcVar23 = (com_pic_t *)0x0;
    }
    else {
      pcVar23 = core->refp[pasVar8[lVar16][1]][1].pic;
    }
    puVar7 = (core->map).map_edge;
    lVar22 = lVar16;
    while (bVar28 = cuh != 0, cuh = cuh + -1, bVar28) {
      if (((byte)(core->map).map_scu[lVar22 + -1] & 0x12) == 0) {
        asVar1 = pasVar8[lVar16];
        asVar2 = (core->map).map_refi[lVar22 + -1];
        if (asVar1 != asVar2) {
          if (asVar2[0] < '\0') {
            pcVar26 = (com_pic_t *)0x0;
          }
          else {
            pcVar26 = *(com_pic_t **)((long)&(*refp)[0].pic + (ulong)(((ushort)asVar2 & 0x7f) << 6))
            ;
          }
          if ((short)asVar2 < 0) {
            pcVar25 = (com_pic_t *)0x0;
          }
          else {
            pcVar25 = core->refp[(ushort)asVar2 >> 8][1].pic;
          }
          if ((pcVar25 == pcVar18) && (pcVar26 == pcVar23)) {
            paasVar9 = (core->map).map_mv;
            if (asVar1[0] < '\0') {
LAB_0011255a:
              if (-1 < (short)asVar1) {
                iVar10 = (int)paasVar9[lVar22][1][0] - (int)paasVar9[lVar22 + -1][0][0];
                iVar12 = -iVar10;
                if (0 < iVar10) {
                  iVar12 = iVar10;
                }
                if (3 < (ushort)iVar12) goto LAB_001123f8;
                iVar12 = (int)paasVar9[lVar22][1][1] - (int)paasVar9[lVar22 + -1][0][1];
                uVar20 = (ushort)iVar12;
                uVar13 = -uVar20;
                if (0 < iVar12) {
                  uVar13 = uVar20;
                }
                goto joined_r0x001125a2;
              }
              goto LAB_001125a8;
            }
            iVar12 = (int)paasVar9[lVar22][0][0] - (int)paasVar9[lVar22 + -1][1][0];
            uVar20 = (ushort)iVar12;
            uVar13 = -uVar20;
            if (0 < iVar12) {
              uVar13 = uVar20;
            }
            if (uVar13 < 4) {
              iVar12 = (int)paasVar9[lVar22][0][1] - (int)paasVar9[lVar22 + -1][1][1];
              uVar20 = (ushort)iVar12;
              uVar13 = -uVar20;
              if (0 < iVar12) {
                uVar13 = uVar20;
              }
              if (uVar13 < 4) goto LAB_0011255a;
            }
          }
          goto LAB_001123f8;
        }
        paasVar9 = (core->map).map_mv;
        if (-1 < asVar1[0]) {
          iVar12 = (int)paasVar9[lVar22][0][0] - (int)paasVar9[lVar22 + -1][0][0];
          uVar20 = (ushort)iVar12;
          uVar13 = -uVar20;
          if (0 < iVar12) {
            uVar13 = uVar20;
          }
          if (uVar13 < 4) {
            iVar12 = (int)paasVar9[lVar22][0][1] - (int)paasVar9[lVar22 + -1][0][1];
            uVar20 = (ushort)iVar12;
            uVar13 = -uVar20;
            if (0 < iVar12) {
              uVar13 = uVar20;
            }
            if (uVar13 < 4) goto LAB_00112467;
          }
          goto LAB_001123f8;
        }
LAB_00112467:
        if (-1 < (short)asVar1) {
          iVar10 = (int)paasVar9[lVar22][1][0] - (int)paasVar9[lVar22 + -1][1][0];
          iVar12 = -iVar10;
          if (0 < iVar10) {
            iVar12 = iVar10;
          }
          if ((ushort)iVar12 < 4) {
            iVar12 = (int)paasVar9[lVar22][1][1] - (int)paasVar9[lVar22 + -1][1][1];
            uVar20 = (ushort)iVar12;
            uVar13 = -uVar20;
            if (0 < iVar12) {
              uVar13 = uVar20;
            }
joined_r0x001125a2:
            if (uVar13 < 4) goto LAB_001125a8;
          }
          goto LAB_001123f8;
        }
LAB_001125a8:
        bVar19 = 0;
      }
      else {
LAB_001123f8:
        bVar19 = 3;
      }
      pbVar24 = puVar7 + lVar22;
      *pbVar24 = *pbVar24 | bVar19;
      lVar22 = lVar22 + lVar27;
    }
  }
  return;
}

Assistant:

void com_deblock_set_edge(com_core_t *core)
{
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    s8 *patch_idx = map->map_patch;
    int i_scu = seqhdr->i_scu;
    int scup = core->cu_scup;
    int lcu_idx = core->lcu_y * seqhdr->pic_width_in_lcu + core->lcu_x;
    int scu_w = core->cu_width  >> MIN_CU_LOG2;
    int scu_h = core->cu_height >> MIN_CU_LOG2;
    int scu_x = core->cu_pix_x  >> MIN_CU_LOG2;
    int scu_y = core->cu_pix_y  >> MIN_CU_LOG2;
    const int grad_mask = (LOOPFILTER_GRID >> 2) - 1;
    const com_scu_t mask = { 0, 1, 0, 0, 1, 0, 0 };
    com_scu_t scu = map->map_scu[scup];

    if ((*(u8*)&scu) & (*(u8*)&mask)) {
        u8 *edge = map->map_edge;

        switch (core->tb_part) {
        case SIZE_2NxhN:
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_hNx2N:              
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_NxN:                
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_force_cu(edge + scup, i_scu, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_force_cu(edge + scup, i_scu, scu_h, EDGE_TYPE_ALL);  // LEFT
        }

    } else {
        com_ref_pic_t(*refp)[REFP_NUM] = core->refp;

#define set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_y) & grad_mask) == 0)  com_df_set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
#define set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_x) & grad_mask) == 0)  com_df_set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
        
        switch (core->tb_part) {
        case SIZE_2NxhN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;
        case SIZE_hNx2N:
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        case SIZE_NxN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_inline(map, i_scu, refp, scu_x, scu_y, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_inline(map, i_scu, refp, scu_x, scu_y, scu_h, EDGE_TYPE_ALL);  // LEFT
        }
    }
}